

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void process_replacement(c2m_ctx_t c2m_ctx,macro_call_t mc)

{
  short sVar1;
  ushort uVar2;
  macro_t pmVar3;
  VARR_token_t *pVVar4;
  token_t *pptVar5;
  pre_ctx *ppVar6;
  VARR_macro_call_t *pVVar7;
  VARR_char *pVVar8;
  pos_t pVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  c2m_ctx_t pcVar15;
  MIR_context_t pMVar16;
  token_t ptVar17;
  token_t ptVar18;
  macro_call_t pmVar19;
  VARR_token_arr_t *pVVar20;
  ulong *puVar21;
  void *pvVar22;
  token_arr_t pVVar23;
  token_t *pptVar24;
  token_arr_t *ppVVar25;
  macro_call_t *__ptr;
  c2m_ctx_t pcVar26;
  node_t_conflict pnVar27;
  long *plVar28;
  undefined8 *puVar29;
  macro_t pmVar30;
  undefined1 *puVar31;
  uint uVar32;
  token_t t;
  ulong uVar33;
  MIR_context_t pMVar34;
  char *format;
  long extraout_RDX;
  VARR_char *pVVar35;
  c2m_ctx_t pcVar36;
  c2m_ctx_t pcVar37;
  c2m_ctx_t pcVar38;
  c2m_ctx_t pcVar39;
  char *pcVar40;
  char **in_R8;
  token_t t_00;
  MIR_context_t pMVar41;
  c2m_ctx_t pcVar42;
  char cVar43;
  ulong uVar44;
  MIR_context_t pMVar45;
  MIR_context_t pMVar46;
  size_t sVar47;
  c2m_ctx_t pcVar48;
  c2m_ctx_t pcVar49;
  size_t sVar50;
  c2mir_options *pcVar51;
  bool bVar52;
  bool bVar53;
  str_t sVar54;
  MIR_context_t pMStack_f8;
  MIR_context_t pMStack_e0;
  MIR_context_t pMStack_d8;
  c2m_ctx_t pcStack_c0;
  uint local_64;
  
  pmVar3 = mc->macro;
  pVVar4 = pmVar3->replacement;
  pcVar39 = (c2m_ctx_t)mc;
  pcVar37 = c2m_ctx;
  if (pVVar4 != (VARR_token_t *)0x0) {
    iVar12 = (int)pVVar4->els_num;
    iVar13 = mc->repl_pos;
    if (iVar13 < iVar12) {
      pptVar24 = pVVar4->varr;
      local_64 = 0xffffffff;
      pcVar38 = (c2m_ctx_t)mc;
      do {
        mc->repl_pos = iVar13 + 1;
        ptVar17 = pptVar24[iVar13];
        sVar1 = *(short *)ptVar17;
        if (sVar1 == 0x103) {
          pcVar37 = (c2m_ctx_t)pmVar3->params;
          pcVar38 = (c2m_ctx_t)ptVar17->repr;
          uVar11 = find_param((VARR_token_t *)pcVar37,(char *)pcVar38);
          if ((int)uVar11 < 0) goto LAB_00190f61;
          pVVar20 = mc->args;
          if (((pVVar20 == (VARR_token_arr_t *)0x0) || (pVVar20->varr == (token_arr_t *)0x0)) ||
             (pVVar20->els_num <= (ulong)uVar11)) {
LAB_001915b8:
            process_replacement_cold_18();
LAB_001915bd:
            process_replacement_cold_9();
LAB_001915c2:
            process_replacement_cold_10();
LAB_001915c7:
            process_replacement_cold_3();
            pcVar39 = pcVar38;
LAB_001915cc:
            pcVar38 = pcVar39;
            process_replacement_cold_7();
LAB_001915d1:
            process_replacement_cold_12();
LAB_001915d6:
            process_replacement_cold_2();
LAB_001915db:
            process_replacement_cold_8();
            pcVar39 = pcVar38;
            goto LAB_001915e0;
          }
          pcVar38 = (c2m_ctx_t)pVVar20->varr[uVar11];
          if (-1 < (int)local_64) {
            pcVar39 = (c2m_ctx_t)(ulong)local_64;
            del_tokens(mc->repl_buffer,local_64,-1);
            pcVar37 = pcVar38;
            if (pcVar38 == (c2m_ctx_t)0x0) goto LAB_001915f9;
            pMVar16 = pcVar38->ctx;
            if (pMVar16 == (MIR_context_t)0x0) {
LAB_0019101d:
              pmVar30 = mc->macro;
            }
            else {
              pptVar5 = (token_t *)pcVar38->env[0].__jmpbuf[0];
              if (pptVar5 == (token_t *)0x0) goto LAB_00191603;
              sVar1 = *(short *)*pptVar5;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar39 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar38,0,1);
                pMVar16 = pcVar38->ctx;
                if (pMVar16 == (MIR_context_t)0x0) goto LAB_0019101d;
              }
              pmVar30 = (macro_t)pcVar38->env[0].__jmpbuf[0];
              if (pmVar30 == (macro_t)0x0) goto LAB_0019160d;
              if (((**(short **)(&pmVar30[1].ignore_p + (long)&pMVar16[-1].wrapper_end_addr * 2) ==
                    10) || (**(short **)
                              (&pmVar30[1].ignore_p + (long)&pMVar16[-1].wrapper_end_addr * 2) ==
                            0x20)) &&
                 (pMVar16 = (MIR_context_t)((long)&pMVar16[-1].wrapper_end_addr + 7),
                 pcVar38->ctx = pMVar16, pMVar16 == (MIR_context_t)0x0)) goto LAB_0019101d;
            }
            ptVar17 = pmVar30->id;
            pcVar40 = (c2m_ctx->empty_str).s;
            sVar47 = (c2m_ctx->empty_str).len;
            pVar9 = ptVar17->pos;
            pnVar27 = new_node(c2m_ctx,N_STR);
            add_pos(c2m_ctx,pnVar27,pVar9);
            (pnVar27->u).s.s = pcVar40;
            (pnVar27->u).s.len = sVar47;
            pcVar10 = (ptVar17->pos).fname;
            lVar14 = *(long *)&(ptVar17->pos).lno;
            sVar54 = uniq_cstr(c2m_ctx,"");
            pcVar40 = sVar54.s;
            pcVar39 = (c2m_ctx_t)0x30;
            pcVar37 = c2m_ctx;
            pcVar15 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar15->ctx = 0x102;
            ((pos_t *)&pcVar15->options)->fname = pcVar10;
            pcVar15->env[0].__jmpbuf[0] = lVar14;
            pcVar15->env[0].__jmpbuf[3] = (long)pcVar40;
            *(undefined4 *)(pcVar15->env[0].__jmpbuf + 1) = 0;
            pcVar15->env[0].__jmpbuf[2] = (long)pnVar27;
            pVVar35 = c2m_ctx->temp_string;
            if ((pVVar35 != (VARR_char *)0x0) &&
               (pcVar26 = (c2m_ctx_t)pVVar35->varr, pcVar26 != (c2m_ctx_t)0x0)) {
              pVVar35->els_num = 0;
              cVar43 = *pcVar40;
              if (cVar43 == '\0') {
                uVar44 = 1;
                sVar47 = 0;
              }
              else {
                do {
                  pcVar40 = pcVar40 + 1;
                  pVVar35 = c2m_ctx->temp_string;
                  pcVar26 = (c2m_ctx_t)pVVar35->varr;
                  if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_001915cc;
                  sVar47 = pVVar35->els_num;
                  uVar44 = sVar47 + 1;
                  if (pVVar35->size < uVar44) {
                    pcVar49 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
                    pcVar39 = pcVar49;
                    pcVar37 = pcVar26;
                    pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar49);
                    pVVar35->varr = (char *)pcVar26;
                    pVVar35->size = (size_t)pcVar49;
                    sVar47 = pVVar35->els_num;
                    uVar44 = sVar47 + 1;
                  }
                  pVVar35->els_num = uVar44;
                  *(char *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = cVar43;
                  cVar43 = *pcVar40;
                } while (cVar43 != '\0');
                pVVar35 = c2m_ctx->temp_string;
                pcVar26 = (c2m_ctx_t)pVVar35->varr;
                if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_00191608;
                sVar47 = pVVar35->els_num;
                uVar44 = sVar47 + 1;
              }
              if (pVVar35->size < uVar44) {
                sVar50 = (uVar44 >> 1) + uVar44;
                pcVar37 = pcVar26;
                pcVar26 = (c2m_ctx_t)realloc(pcVar26,sVar50);
                pVVar35->varr = (char *)pcVar26;
                pVVar35->size = sVar50;
                sVar47 = pVVar35->els_num;
                uVar44 = sVar47 + 1;
              }
              pVVar35->els_num = uVar44;
              *(undefined1 *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = 0x22;
              if (pcVar38->ctx != (MIR_context_t)0x0) {
                pMVar16 = (MIR_context_t)0x0;
                do {
                  pptVar5 = (token_t *)pcVar38->env[0].__jmpbuf[0];
                  if (pptVar5 == (token_t *)0x0) goto LAB_001915d1;
                  ptVar17 = pptVar5[(long)pMVar16];
                  sVar1 = *(short *)ptVar17;
                  if ((sVar1 == 0x20) || (sVar1 == 10)) {
                    pVVar35 = c2m_ctx->temp_string;
                    pcVar39 = (c2m_ctx_t)pVVar35->varr;
                    if (pcVar39 == (c2m_ctx_t)0x0) goto LAB_001915db;
                    sVar47 = pVVar35->els_num;
                    uVar44 = sVar47 + 1;
                    if (pVVar35->size < uVar44) {
                      sVar50 = (uVar44 >> 1) + uVar44;
                      pcVar37 = pcVar39;
                      pcVar39 = (c2m_ctx_t)realloc(pcVar39,sVar50);
                      pVVar35->varr = (char *)pcVar39;
                      pVVar35->size = sVar50;
                      sVar47 = pVVar35->els_num;
                      uVar44 = sVar47 + 1;
                    }
                    pVVar35->els_num = uVar44;
                    *(undefined1 *)((long)pcVar39->env[0].__jmpbuf + (sVar47 - 0x10)) = 0x20;
                  }
                  else {
                    pcVar40 = ptVar17->repr;
                    cVar43 = *pcVar40;
                    if (cVar43 != '\0') {
                      pMVar34 = (MIR_context_t)((long)&pMVar16->gen_ctx + 1);
                      do {
                        uVar11 = 0;
                        if (pcVar38->ctx != pMVar34) {
                          if ((pcVar38->ctx <= pMVar34) ||
                             (pptVar5 = (token_t *)pcVar38->env[0].__jmpbuf[0],
                             pptVar5 == (token_t *)0x0)) goto LAB_001915bd;
                          uVar11 = (uint)*pptVar5[(long)((long)&pMVar16->gen_ctx + 1)]->repr;
                        }
                        if (cVar43 == '\"') {
LAB_001912ac:
                          pVVar35 = c2m_ctx->temp_string;
                          pcVar39 = (c2m_ctx_t)pVVar35->varr;
                          if (pcVar39 == (c2m_ctx_t)0x0) goto LAB_001915c2;
                          sVar47 = pVVar35->els_num;
                          uVar44 = sVar47 + 1;
                          if (pVVar35->size < uVar44) {
                            sVar50 = (uVar44 >> 1) + uVar44;
                            pcVar37 = pcVar39;
                            pcVar39 = (c2m_ctx_t)realloc(pcVar39,sVar50);
                            pVVar35->varr = (char *)pcVar39;
                            pVVar35->size = sVar50;
                            sVar47 = pVVar35->els_num;
                            uVar44 = sVar47 + 1;
                          }
                          pVVar35->els_num = uVar44;
                          *(undefined1 *)((long)pcVar39->env[0].__jmpbuf + (sVar47 - 0x10)) = 0x5c;
                          cVar43 = *pcVar40;
                        }
                        else if (cVar43 == '\\') {
                          cVar43 = '\\';
                          if (((0x37 < uVar11 - 0x3f) ||
                              ((0xa880cc20000001U >> ((ulong)(uVar11 - 0x3f) & 0x3f) & 1) == 0)) &&
                             ((uVar11 & 0xffffffdf) != 0x58 && (uVar11 & 0xfffffff8) != 0x30))
                          goto LAB_001912ac;
                        }
                        pVVar35 = c2m_ctx->temp_string;
                        pcVar39 = (c2m_ctx_t)pVVar35->varr;
                        if (pcVar39 == (c2m_ctx_t)0x0) {
                          process_replacement_cold_11();
                          goto LAB_001915b8;
                        }
                        sVar47 = pVVar35->els_num;
                        uVar44 = sVar47 + 1;
                        if (pVVar35->size < uVar44) {
                          sVar50 = (uVar44 >> 1) + uVar44;
                          pcVar37 = pcVar39;
                          pcVar39 = (c2m_ctx_t)realloc(pcVar39,sVar50);
                          pVVar35->varr = (char *)pcVar39;
                          pVVar35->size = sVar50;
                          sVar47 = pVVar35->els_num;
                          uVar44 = sVar47 + 1;
                        }
                        pVVar35->els_num = uVar44;
                        *(char *)((long)pcVar39->env[0].__jmpbuf + (sVar47 - 0x10)) = cVar43;
                        cVar43 = pcVar40[1];
                        pcVar40 = pcVar40 + 1;
                      } while (cVar43 != '\0');
                    }
                  }
                  pMVar16 = (MIR_context_t)((long)&pMVar16->gen_ctx + 1);
                } while (pMVar16 < pcVar38->ctx);
              }
              pVVar35 = c2m_ctx->temp_string;
              pcVar39 = (c2m_ctx_t)pVVar35->varr;
              if (pcVar39 != (c2m_ctx_t)0x0) {
                sVar47 = pVVar35->els_num;
                uVar44 = sVar47 + 1;
                if (pVVar35->size < uVar44) {
                  pcVar26 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
                  pcVar38 = pcVar26;
                  pcVar37 = pcVar39;
                  pcVar39 = (c2m_ctx_t)realloc(pcVar39,(size_t)pcVar26);
                  pVVar35->varr = (char *)pcVar39;
                  pVVar35->size = (size_t)pcVar26;
                  sVar47 = pVVar35->els_num;
                  uVar44 = sVar47 + 1;
                }
                pVVar35->els_num = uVar44;
                *(undefined1 *)((long)pcVar39->env[0].__jmpbuf + (sVar47 - 0x10)) = 0x22;
                pVVar35 = c2m_ctx->temp_string;
                pcVar39 = (c2m_ctx_t)pVVar35->varr;
                if (pcVar39 != (c2m_ctx_t)0x0) {
                  sVar47 = pVVar35->els_num;
                  uVar44 = sVar47 + 1;
                  if (pVVar35->size < uVar44) {
                    pcVar26 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
                    pcVar38 = pcVar26;
                    pcVar37 = pcVar39;
                    pcVar39 = (c2m_ctx_t)realloc(pcVar39,(size_t)pcVar26);
                    pVVar35->varr = (char *)pcVar39;
                    pVVar35->size = (size_t)pcVar26;
                    sVar47 = pVVar35->els_num;
                    uVar44 = sVar47 + 1;
                  }
                  pVVar35->els_num = uVar44;
                  *(undefined1 *)((long)pcVar39->env[0].__jmpbuf + (sVar47 - 0x10)) = 0;
                  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
                    sVar54 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
                    pcVar15->env[0].__jmpbuf[3] = (long)sVar54.s;
                    set_string_val(c2m_ctx,(token_t)pcVar15,c2m_ctx->temp_string,0x20);
                    goto LAB_00190f77;
                  }
                  goto LAB_001915fe;
                }
                goto LAB_001915f4;
              }
              goto LAB_001915ef;
            }
            goto LAB_001915e5;
          }
          iVar13 = mc->repl_pos;
          lVar14 = (long)iVar13;
          if (((lVar14 < 2) ||
              ((*(short *)pptVar24[lVar14 + -2] != 0x142 &&
               (((iVar13 == 2 || (*(short *)pptVar24[lVar14 + -2] != 0x20)) ||
                (*(short *)pptVar24[lVar14 + -3] != 0x142)))))) &&
             (((iVar12 <= iVar13 || (*(short *)pptVar24[lVar14] != 0x142)) &&
              ((iVar12 <= iVar13 + 1 ||
               ((*(short *)pptVar24[iVar13 + 1] != 0x142 || (*(short *)pptVar24[lVar14] != 0x20)))))
              ))) {
            pcVar40 = (ptVar17->pos).fname;
            iVar12 = (ptVar17->pos).lno;
            iVar13 = (ptVar17->pos).ln_pos;
            ptVar18 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar18 = 0x144;
            (ptVar18->pos).fname = pcVar40;
            (ptVar18->pos).lno = iVar12;
            (ptVar18->pos).ln_pos = iVar13;
            ptVar18->repr = "";
            ptVar18->node_code = N_IGNORE;
            ptVar18->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar18);
            copy_and_push_back(c2m_ctx,(VARR_token_t *)pcVar38,mc->pos);
            pcVar40 = (ptVar17->pos).fname;
            iVar12 = (ptVar17->pos).lno;
            iVar13 = (ptVar17->pos).ln_pos;
            ptVar17 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar17 = 0x143;
            (ptVar17->pos).fname = pcVar40;
            (ptVar17->pos).lno = iVar12;
            (ptVar17->pos).ln_pos = iVar13;
            ptVar17->repr = "";
            ptVar17->node_code = N_IGNORE;
            ptVar17->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar17);
            return;
          }
          if (pcVar38 == (c2m_ctx_t)0x0) goto LAB_001915c7;
          if (pcVar38->ctx == (MIR_context_t)0x1) {
            pptVar5 = (token_t *)pcVar38->env[0].__jmpbuf[0];
            if (pptVar5 != (token_t *)0x0) {
              sVar1 = *(short *)*pptVar5;
              if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00190f19;
              goto LAB_00190ee0;
            }
            goto LAB_001915d6;
          }
          if (pcVar38->ctx == (MIR_context_t)0x0) {
LAB_00190f19:
            pcVar40 = (ptVar17->pos).fname;
            lVar14 = *(long *)&(ptVar17->pos).lno;
            pcVar15 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar15->ctx = 0x141;
            ((pos_t *)&pcVar15->options)->fname = pcVar40;
            pcVar15->env[0].__jmpbuf[0] = lVar14;
            pcVar15->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar15->env[0].__jmpbuf + 1) = 0;
            pcVar15->env[0].__jmpbuf[2] = 0;
            goto LAB_00190f77;
          }
LAB_00190ee0:
          pcVar37 = (c2m_ctx_t)mc->repl_buffer;
          add_tokens((VARR_token_t *)pcVar37,(VARR_token_t *)pcVar38);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              if (mc->repl_buffer == (VARR_token_t *)0x0) goto LAB_001915ea;
              local_64 = (uint)mc->repl_buffer->els_num;
            }
            else {
              local_64 = 0xffffffff;
            }
          }
LAB_00190f61:
          pcVar15 = (c2m_ctx_t)copy_token(c2m_ctx,ptVar17,mc->pos);
LAB_00190f77:
          pcVar37 = (c2m_ctx_t)mc->repl_buffer;
          add_token((VARR_token_t *)pcVar37,(token_t)pcVar15);
          pcVar38 = pcVar15;
        }
        iVar13 = mc->repl_pos;
      } while (iVar13 < iVar12);
    }
    ptVar17 = get_next_pptoken_1(c2m_ctx,0);
    unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar17);
    pcVar40 = (ptVar17->pos).fname;
    iVar12 = (ptVar17->pos).lno;
    iVar13 = (ptVar17->pos).ln_pos;
    ptVar17 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar17 = 0x145;
    (ptVar17->pos).fname = pcVar40;
    (ptVar17->pos).lno = iVar12;
    (ptVar17->pos).ln_pos = iVar13;
    ptVar17->repr = "";
    ptVar17->node_code = N_IGNORE;
    ptVar17->node = (node_t_conflict)0x0;
    unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar17);
    pVVar4 = mc->repl_buffer;
    do_concat(c2m_ctx,pVVar4);
    push_back(c2m_ctx,pVVar4);
    pmVar3->ignore_p = 1;
    return;
  }
LAB_001915e0:
  process_replacement_cold_19();
LAB_001915e5:
  process_replacement_cold_16();
  pcVar38 = pcVar39;
LAB_001915ea:
  process_replacement_cold_1();
LAB_001915ef:
  process_replacement_cold_15();
LAB_001915f4:
  process_replacement_cold_14();
  pcVar39 = pcVar38;
LAB_001915f9:
  pcVar38 = pcVar39;
  process_replacement_cold_17();
LAB_001915fe:
  process_replacement_cold_13();
  pcVar39 = pcVar38;
LAB_00191603:
  process_replacement_cold_5();
LAB_00191608:
  process_replacement_cold_6();
  pcVar38 = pcVar37;
LAB_0019160d:
  process_replacement_cold_4();
  ppVar6 = pcVar38->pre_ctx;
  while( true ) {
    ptVar17 = get_next_pptoken_1(pcVar38,0);
    if ((short)*(uint *)ptVar17 != 0x145) break;
    pop_macro_call((c2m_ctx_t)pcVar38->pre_ctx->macro_call_stack);
  }
  uVar11 = *(uint *)ptVar17 & 0xffff;
  pMVar16 = (MIR_context_t)(ulong)uVar11;
  if ((uVar11 == 10) || (uVar11 == 0x20)) {
    ptVar18 = get_next_pptoken_1(pcVar38,0);
    pMVar16 = (MIR_context_t)(ulong)*(ushort *)ptVar18;
    t_00 = ptVar17;
  }
  else {
    t_00 = (token_t)0x0;
    ptVar18 = ptVar17;
  }
  if ((int)pMVar16 != 0x28) {
    unget_next_pptoken((c2m_ctx_t)pcVar38->buffered_tokens,ptVar18);
    if (t_00 != (token_t)0x0) {
      unget_next_pptoken((c2m_ctx_t)pcVar38->buffered_tokens,t_00);
    }
    out_token(pcVar38,t);
    return;
  }
  pcVar37 = (c2m_ctx_t)(t->pos).fname;
  pmVar19 = new_macro_call((macro_t)pcVar39,t->pos);
  pmVar3 = pmVar19->macro;
  pcVar39 = (c2m_ctx_t)&DAT_00000018;
  pVVar20 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar20 == (VARR_token_arr_t *)0x0) {
LAB_00191caf:
    mir_varr_error((char *)pcVar39);
  }
  pVVar20->els_num = 0;
  pVVar20->size = 0x10;
  pcStack_c0 = (c2m_ctx_t)malloc(0x80);
  pcVar39 = (c2m_ctx_t)&DAT_00000018;
  pVVar20->varr = (token_arr_t *)pcStack_c0;
  puVar21 = (ulong *)malloc(0x18);
  if (puVar21 == (ulong *)0x0) goto LAB_00191caf;
  pcVar39 = (c2m_ctx_t)0x80;
  *puVar21 = 0;
  puVar21[1] = 0x10;
  pvVar22 = malloc(0x80);
  puVar21[2] = (ulong)pvVar22;
  pVVar4 = pmVar3->params;
  if (pVVar4 == (VARR_token_t *)0x0) {
LAB_00191cc3:
    try_param_macro_call_cold_16();
LAB_00191cc8:
    try_param_macro_call_cold_14();
    goto LAB_00191ccd;
  }
  pMVar34 = (MIR_context_t)pVVar4->els_num;
  iVar12 = 0;
  bVar52 = false;
  if (pMVar34 != (MIR_context_t)0x1) {
LAB_00191751:
    pMVar41 = (MIR_context_t)0x10;
    bVar53 = false;
    pMStack_e0 = (MIR_context_t)0x0;
    pMStack_d8 = (MIR_context_t)0x0;
    pMVar45 = (MIR_context_t)((long)&pMVar34[-1].wrapper_end_addr + 7);
    do {
      pcVar37 = (c2m_ctx_t)0x0;
      pcVar39 = pcVar38;
      pcVar15 = (c2m_ctx_t)get_next_pptoken_1(pcVar38,0);
      uVar2 = *(ushort *)&pcVar15->ctx;
      if (uVar2 == 0x145) {
        pcVar37 = (c2m_ctx_t)0x0;
        pcVar15 = (c2m_ctx_t)get_next_pptoken_1(pcVar38,0);
        pcVar39 = (c2m_ctx_t)pcVar38->pre_ctx->macro_call_stack;
        pop_macro_call(pcVar39);
        uVar2 = *(ushort *)&pcVar15->ctx;
      }
      uVar11 = (uint)uVar2;
      uVar32 = uVar11 * 0x10000 + 0xfec30000 >> 0x10;
      if (((uVar32 < 0xb) && (pcVar37 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar32 & 0x1f) & 1) != 0)) ||
         (pMVar16 = (MIR_context_t)(ulong)CONCAT31((int3)(uVar11 * 0x10000 >> 8),uVar11 == 0x23),
         (bool)(bVar53 & uVar11 == 0x23))) {
LAB_001919f1:
        if (uVar11 != 0x29) {
          in_R8 = (char **)pmVar3->id->repr;
          error(pcVar38,0x1c19de,(char *)pcVar15->options,pcVar15->env[0].__jmpbuf[0]);
          pcVar39 = (c2m_ctx_t)pcVar38->buffered_tokens;
          pcVar37 = pcVar15;
          unget_next_pptoken(pcVar39,(token_t)pcVar15);
        }
        pMVar16 = pMStack_e0;
        if (pcStack_c0 == (c2m_ctx_t)0x0) goto LAB_00191cc8;
        pMVar45 = (MIR_context_t)((long)&pMStack_e0->gen_ctx + 1);
        if (pMVar41 < pMVar45) {
          pMVar41 = (MIR_context_t)((long)&pMVar45->gen_ctx + ((ulong)pMVar45 >> 1));
          pcVar37 = (c2m_ctx_t)((long)pMVar41 * 8);
          pcVar39 = pcStack_c0;
          pcStack_c0 = (c2m_ctx_t)realloc(pcStack_c0,(size_t)pcVar37);
          pVVar20->varr = (token_arr_t *)pcStack_c0;
          pVVar20->size = (size_t)pMVar41;
          pMVar45 = (MIR_context_t)((long)&((MIR_context_t)pVVar20->els_num)->gen_ctx + 1);
          pMVar16 = (MIR_context_t)pVVar20->els_num;
        }
        pVVar20->els_num = (size_t)pMVar45;
        pcStack_c0->env[0].__jmpbuf[(long)((long)&pMVar16[-1].wrapper_end_addr + 6)] = (long)puVar21
        ;
        if ((pMVar34 == (MIR_context_t)0x0) && (pMVar45 == (MIR_context_t)0x1)) {
          if (pVVar20->varr == (token_arr_t *)0x0) goto LAB_00191cdc;
          pcVar26 = (c2m_ctx_t)*pVVar20->varr;
          if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_00191ce1;
          if (pcVar26->ctx == (MIR_context_t)0x0) {
            pcVar39 = (c2m_ctx_t)pcVar26->env[0].__jmpbuf[0];
            pVVar20->els_num = 0;
            if (pcVar39 == (c2m_ctx_t)0x0) goto LAB_00191cfa;
LAB_00191c30:
            free(pcVar39);
            free(pcVar26);
            pcVar39 = pcVar26;
            goto LAB_00191c3d;
          }
          if (pcVar26->ctx == (MIR_context_t)0x1) {
            pcVar39 = (c2m_ctx_t)pcVar26->env[0].__jmpbuf[0];
            if (pcVar39 == (c2m_ctx_t)0x0) goto LAB_00191cf5;
            if (*(short *)&pcVar39->ctx->gen_ctx == 0x20) {
              pVVar20->els_num = 0;
              goto LAB_00191c30;
            }
          }
        }
        if (pMVar45 <= pMVar34) {
          if (pMVar34 <= pMVar45) goto LAB_00191c3d;
          pMStack_f8 = (MIR_context_t)0x1c1a1d;
          goto LAB_00191b75;
        }
        ppVVar25 = pVVar20->varr;
        if (ppVVar25 == (token_arr_t *)0x0) goto LAB_00191ce6;
        pVVar23 = ppVVar25[(long)pMVar34];
        if (pVVar23 == (token_arr_t)0x0) goto LAB_00191ceb;
        if (pVVar23->els_num != 0) {
          if (pVVar23->varr == (token_t *)0x0) goto LAB_00191cf0;
          pcVar15 = (c2m_ctx_t)*pVVar23->varr;
        }
        pMStack_f8 = (MIR_context_t)0x1c19fa;
        goto LAB_00191b23;
      }
      if (iVar12 == 0) {
        if (uVar11 == 0x29) goto LAB_001919f1;
        if ((bVar52) || (uVar11 != 0x2c)) goto LAB_001917fe;
        if (pcStack_c0 == (c2m_ctx_t)0x0) goto LAB_00191cd2;
        pMVar46 = (MIR_context_t)((long)&pMStack_d8->gen_ctx + 1);
        pMVar16 = pMStack_d8;
        pMStack_d8 = pMVar46;
        if (pMVar41 < pMVar46) {
          pMVar41 = (MIR_context_t)((long)&pMVar46->gen_ctx + ((ulong)pMVar46 >> 1));
          pcVar37 = (c2m_ctx_t)((long)pMVar41 * 8);
          pcStack_c0 = (c2m_ctx_t)realloc(pcStack_c0,(size_t)pcVar37);
          pVVar20->varr = (token_arr_t *)pcStack_c0;
          pVVar20->size = (size_t)pMVar41;
          pMVar16 = (MIR_context_t)pVVar20->els_num;
          pMStack_d8 = (MIR_context_t)((long)&pMVar16->gen_ctx + 1);
        }
        pcVar39 = (c2m_ctx_t)&DAT_00000018;
        pVVar20->els_num = (size_t)pMStack_d8;
        pcStack_c0->env[0].__jmpbuf[(long)((long)&pMVar16[-1].wrapper_end_addr + 6)] = (long)puVar21
        ;
        puVar21 = (ulong *)malloc(0x18);
        if (puVar21 == (ulong *)0x0) goto LAB_00191caf;
        pcVar39 = (c2m_ctx_t)0x80;
        *puVar21 = 0;
        puVar21[1] = 0x10;
        pvVar22 = malloc(0x80);
        puVar21[2] = (ulong)pvVar22;
        iVar12 = 0;
        if (pMStack_d8 == pMVar45) {
          pVVar4 = pmVar3->params;
          if (((pVVar4 == (VARR_token_t *)0x0) ||
              (pMVar16 = (MIR_context_t)pVVar4->varr, pMVar16 == (MIR_context_t)0x0)) ||
             ((MIR_context_t)pVVar4->els_num <= pMVar45)) goto LAB_00191cbe;
          iVar13 = strcmp(*(char **)(*(long *)((long)pMVar16 + (long)pMVar34 * 8 + -8) + 0x28),"..."
                         );
          bVar52 = iVar13 == 0;
          pMStack_d8 = pMVar45;
          pMStack_e0 = pMVar45;
        }
        else {
          bVar52 = false;
          pMStack_e0 = pMStack_d8;
        }
      }
      else {
LAB_001917fe:
        pvVar22 = (void *)puVar21[2];
        if (pvVar22 == (void *)0x0) goto LAB_00191cb9;
        uVar33 = *puVar21;
        uVar44 = uVar33 + 1;
        if (puVar21[1] < uVar44) {
          uVar44 = (uVar44 >> 1) + uVar44;
          pvVar22 = realloc(pvVar22,uVar44 * 8);
          puVar21[2] = (ulong)pvVar22;
          puVar21[1] = uVar44;
          uVar33 = *puVar21;
          uVar44 = uVar33 + 1;
        }
        *puVar21 = uVar44;
        *(c2m_ctx_t *)((long)pvVar22 + uVar33 * 8) = pcVar15;
        if (*(short *)&pcVar15->ctx == 0x28) {
          iVar12 = iVar12 + 1;
        }
        else if (*(short *)&pcVar15->ctx == 0x29) {
          iVar12 = iVar12 + -1;
        }
      }
      bVar53 = *(short *)&pcVar15->ctx == 10;
    } while( true );
  }
  if (pVVar4->varr != (token_t *)0x0) {
    bVar52 = *(short *)*pVVar4->varr == 0x10f;
    goto LAB_00191751;
  }
  goto LAB_00191cd7;
LAB_00191b75:
  pMVar46 = (MIR_context_t)((long)&pMVar45->gen_ctx + 1);
  pcVar39 = (c2m_ctx_t)&DAT_00000018;
  pVVar23 = (token_arr_t)malloc(0x18);
  if (pVVar23 != (token_arr_t)0x0) {
    pcVar39 = (c2m_ctx_t)0x80;
    pVVar23->els_num = 0;
    pVVar23->size = 0x10;
    pptVar24 = (token_t *)malloc(0x80);
    pVVar23->varr = pptVar24;
    ppVVar25 = pVVar20->varr;
    if (ppVVar25 != (token_arr_t *)0x0) goto code_r0x00191bb5;
    try_param_macro_call_cold_6();
LAB_00191cb9:
    try_param_macro_call_cold_1();
LAB_00191cbe:
    try_param_macro_call_cold_2();
    goto LAB_00191cc3;
  }
  goto LAB_00191caf;
code_r0x00191bb5:
  pMVar16 = pMVar45;
  if (pMVar41 <= pMVar45) {
    pMVar41 = (MIR_context_t)((long)&pMVar46->gen_ctx + ((ulong)pMVar46 >> 1));
    pcVar37 = (c2m_ctx_t)((long)pMVar41 * 8);
    ppVVar25 = (token_arr_t *)realloc(ppVVar25,(size_t)pcVar37);
    pVVar20->varr = ppVVar25;
    pVVar20->size = (size_t)pMVar41;
  }
  pVVar20->els_num = (size_t)pMVar46;
  ppVVar25[(long)pMVar45] = pVVar23;
  pMVar45 = pMVar46;
  if (pMVar34 <= pMVar46) goto LAB_00191bf5;
  goto LAB_00191b75;
  while( true ) {
    pcVar48 = (c2m_ctx_t)((long)&pcVar48[-1].gen_ctx + 7);
    pcVar49 = (c2m_ctx_t)(((__jmp_buf_tag *)pcVar49)->__jmpbuf + 1);
    if (pcVar15 == pcVar48) break;
LAB_00191dfe:
    pcVar38 = (c2m_ctx_t)((__jmp_buf_tag *)pcVar49)->__jmpbuf[0];
    if (*(int *)(pcVar38->env[0].__jmpbuf + 1) == 0x19) {
      pVVar35 = pcVar39->symbol_text;
      if ((pVVar35 == (VARR_char *)0x0) ||
         (pcVar26 = (c2m_ctx_t)pVVar35->varr, pcVar26 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar35->els_num = 0;
      pVVar8 = pcVar39->temp_string;
      if ((pVVar8 == (VARR_char *)0x0) || (pVVar8->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar8->els_num = 0;
      pcVar38 = (c2m_ctx_t)pVVar35->els_num;
      puVar31 = (undefined1 *)((long)&pcVar38->ctx + 1);
      if ((undefined1 *)pVVar35->size < puVar31) {
        pcVar15 = pcVar26;
        pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)(puVar31 + ((ulong)puVar31 >> 1)));
        pVVar35->varr = (char *)pcVar26;
        pVVar35->size = (size_t)(puVar31 + ((ulong)puVar31 >> 1));
        pcVar38 = (c2m_ctx_t)pVVar35->els_num;
        puVar31 = (undefined1 *)((long)&pcVar38->ctx + 1);
      }
      pVVar35->els_num = (size_t)puVar31;
      *(undefined1 *)((long)pcVar38->env[0].__saved_mask.__val + (long)(pcVar26->env + -1) + 0x60) =
           0x3c;
      if (pcVar42 < (c2m_ctx_t)((long)pcVar36 - (long)pcVar48)) goto LAB_00191f68;
      goto LAB_0019205a;
    }
  }
LAB_00191e17:
  if (pcVar26 != (c2m_ctx_t)0x0) goto LAB_00191e1c;
  goto LAB_00191e37;
LAB_00191f68:
  do {
    pptVar5 = (token_t *)pcVar37->env[0].__jmpbuf[0];
    if ((pptVar5 == (token_t *)0x0) || ((c2m_ctx_t)pcVar37->ctx <= pcVar42)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar40 = pptVar5[(long)pcVar42]->repr;
    cVar43 = *pcVar40;
    while (cVar43 != '\0') {
      pVVar35 = pcVar39->symbol_text;
      pcVar26 = (c2m_ctx_t)pVVar35->varr;
      if (pcVar26 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar47 = pVVar35->els_num;
      uVar44 = sVar47 + 1;
      if (pVVar35->size < uVar44) {
        pcVar49 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
        pcVar38 = pcVar49;
        pcVar15 = pcVar26;
        pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar49);
        pVVar35->varr = (char *)pcVar26;
        pVVar35->size = (size_t)pcVar49;
        sVar47 = pVVar35->els_num;
        uVar44 = sVar47 + 1;
      }
      pVVar35->els_num = uVar44;
      *(char *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = cVar43;
      pVVar35 = pcVar39->temp_string;
      pcVar26 = (c2m_ctx_t)pVVar35->varr;
      if (pcVar26 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar47 = pVVar35->els_num;
      cVar43 = *pcVar40;
      uVar44 = sVar47 + 1;
      if (pVVar35->size < uVar44) {
        pcVar49 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
        pcVar38 = pcVar49;
        pcVar15 = pcVar26;
        pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar49);
        pVVar35->varr = (char *)pcVar26;
        pVVar35->size = (size_t)pcVar49;
        sVar47 = pVVar35->els_num;
        uVar44 = sVar47 + 1;
      }
      pVVar35->els_num = uVar44;
      *(char *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = cVar43;
      cVar43 = pcVar40[1];
      pcVar40 = pcVar40 + 1;
    }
    pcVar42 = (c2m_ctx_t)((long)&pcVar42->ctx + 1);
  } while ((c2m_ctx_t)((long)pcVar36 - (long)pcVar48) != pcVar42);
LAB_0019205a:
  pVVar35 = pcVar39->symbol_text;
  pcVar26 = (c2m_ctx_t)pVVar35->varr;
  if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar47 = pVVar35->els_num;
  uVar44 = sVar47 + 1;
  if (pVVar35->size < uVar44) {
    pcVar49 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
    pcVar38 = pcVar49;
    pcVar15 = pcVar26;
    pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar49);
    pVVar35->varr = (char *)pcVar26;
    pVVar35->size = (size_t)pcVar49;
    sVar47 = pVVar35->els_num;
    uVar44 = sVar47 + 1;
  }
  pVVar35->els_num = uVar44;
  *(undefined1 *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = 0x3e;
  pVVar35 = pcVar39->symbol_text;
  pcVar26 = (c2m_ctx_t)pVVar35->varr;
  if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar47 = pVVar35->els_num;
  uVar44 = sVar47 + 1;
  if (pVVar35->size < uVar44) {
    pcVar49 = (c2m_ctx_t)((uVar44 >> 1) + uVar44);
    pcVar38 = pcVar49;
    pcVar15 = pcVar26;
    pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar49);
    pVVar35->varr = (char *)pcVar26;
    pVVar35->size = (size_t)pcVar49;
    sVar47 = pVVar35->els_num;
    uVar44 = sVar47 + 1;
  }
  pVVar35->els_num = uVar44;
  *(undefined1 *)((long)pcVar26->env[0].__jmpbuf + (sVar47 - 0x10)) = 0;
  pVVar35 = pcVar39->temp_string;
  pcVar40 = pVVar35->varr;
  if (pcVar40 == (char *)0x0) goto LAB_0019226f;
  sVar47 = pVVar35->els_num;
  uVar44 = sVar47 + 1;
  if (pVVar35->size < uVar44) {
    sVar50 = (uVar44 >> 1) + uVar44;
    pcVar40 = (char *)realloc(pcVar40,sVar50);
    pVVar35->varr = pcVar40;
    pVVar35->size = sVar50;
    sVar47 = pVVar35->els_num;
    uVar44 = sVar47 + 1;
  }
  pVVar35->els_num = uVar44;
  pcVar40[sVar47] = '\0';
  pcVar38 = (c2m_ctx_t)((ulong)pcVar36 & 0xffffffff);
  pcVar15 = pcVar37;
  del_tokens((VARR_token_t *)pcVar37,(int)pcVar36,-(int)pcVar48);
  if (pcVar39->symbol_text != (VARR_char *)0x0) {
    if (pcVar39->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar40 = pcVar39->symbol_text->varr;
    sVar54 = uniq_cstr(pcVar39,pcVar39->temp_string->varr);
    pnVar27 = new_node(pcVar39,N_STR);
    add_pos(pcVar39,pnVar27,pVar9);
    (pnVar27->u).s = sVar54;
    sVar54 = uniq_cstr(pcVar39,pcVar40);
    pcVar38 = (c2m_ctx_t)0x30;
    pcVar15 = pcVar39;
    ptVar17 = (token_t)reg_malloc(pcVar39,0x30);
    *(undefined4 *)ptVar17 = 0x13e;
    (ptVar17->pos).fname = (char *)pcVar51;
    *(token_t **)&(ptVar17->pos).lno = pptVar24;
    ptVar17->repr = sVar54.s;
    ptVar17->node_code = N_IGNORE;
    ptVar17->node = pnVar27;
    pptVar24 = (token_t *)pcVar37->env[0].__jmpbuf[0];
    if ((pptVar24 != (token_t *)0x0) && (pcVar26 = (c2m_ctx_t)pcVar37->ctx, pcVar36 < pcVar26)) {
      pptVar24[(long)pcVar36] = ptVar17;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    free(pcVar39);
    free(pcVar37);
    pcVar39 = pcVar37;
    pMVar45 = pMVar16;
    if (pMVar16 <= pMVar34) break;
LAB_00191b23:
    pMVar16 = (MIR_context_t)((long)&pMVar45[-1].wrapper_end_addr + 7);
    pVVar20->els_num = (size_t)pMVar16;
    pcVar37 = (c2m_ctx_t)ppVVar25[(long)((long)&pMVar45[-1].wrapper_end_addr + 7)];
    if ((pcVar37 == (c2m_ctx_t)0x0) ||
       (pcVar39 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0], pcVar39 == (c2m_ctx_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00191caf;
    }
  }
LAB_00191bf5:
  pcVar37 = (c2m_ctx_t)((pos_t *)&pcVar15->options)->fname;
  in_R8 = (char **)pmVar3->id->repr;
  error(pcVar38,pMStack_f8,(char *)pcVar37,pcVar15->env[0].__jmpbuf[0]);
  pMVar16 = pMStack_f8;
  pcVar39 = pcVar38;
LAB_00191c3d:
  pmVar19->args = pVVar20;
  pVVar7 = ppVar6->macro_call_stack;
  __ptr = pVVar7->varr;
  if (__ptr != (macro_call_t *)0x0) {
    sVar47 = pVVar7->els_num;
    uVar44 = sVar47 + 1;
    if (pVVar7->size < uVar44) {
      sVar47 = (uVar44 >> 1) + uVar44;
      __ptr = (macro_call_t *)realloc(__ptr,sVar47 * 8);
      pVVar7->varr = __ptr;
      pVVar7->size = sVar47;
      sVar47 = pVVar7->els_num;
      uVar44 = sVar47 + 1;
    }
    pVVar7->els_num = uVar44;
    __ptr[sVar47] = pmVar19;
    return;
  }
LAB_00191ccd:
  try_param_macro_call_cold_8();
LAB_00191cd2:
  try_param_macro_call_cold_3();
LAB_00191cd7:
  try_param_macro_call_cold_15();
LAB_00191cdc:
  try_param_macro_call_cold_13();
LAB_00191ce1:
  try_param_macro_call_cold_12();
LAB_00191ce6:
  try_param_macro_call_cold_11();
LAB_00191ceb:
  try_param_macro_call_cold_10();
LAB_00191cf0:
  try_param_macro_call_cold_7();
LAB_00191cf5:
  try_param_macro_call_cold_4();
LAB_00191cfa:
  try_param_macro_call_cold_5();
  pvVar22 = (void *)pcVar39->env[0].__jmpbuf[0];
  if (pvVar22 != (void *)0x0) {
    pMVar34 = pcVar39->ctx;
    pMVar16 = (MIR_context_t)((long)&pMVar34->gen_ctx + 1);
    if ((MIR_context_t)pcVar39->options < pMVar16) {
      pcVar51 = (c2mir_options *)((long)&pMVar16->gen_ctx + ((ulong)pMVar16 >> 1));
      pvVar22 = realloc(pvVar22,(long)pcVar51 * 8);
      pcVar39->env[0].__jmpbuf[0] = (long)pvVar22;
      pcVar39->options = pcVar51;
      pMVar34 = pcVar39->ctx;
      pMVar16 = (MIR_context_t)((long)&pMVar34->gen_ctx + 1);
    }
    pcVar39->ctx = pMVar16;
    *(c2m_ctx_t *)((long)pvVar22 + (long)pMVar34 * 8) = pcVar37;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar39 != (c2m_ctx_t)0x0) && (pcVar39->env[0].__jmpbuf[0] != 0)) &&
     (pMVar16 = pcVar39->ctx, pMVar16 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar38 = pcVar37;
  pcVar15 = pcVar39;
  if (pcVar37 == (c2m_ctx_t)0x0) {
LAB_00192242:
    get_header_name_cold_15();
LAB_00192247:
    get_header_name_cold_13();
LAB_0019224c:
    get_header_name_cold_12();
  }
  else {
    pcVar26 = (c2m_ctx_t)pcVar37->ctx;
    if (pcVar26 != (c2m_ctx_t)0x0) {
      pcVar15 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
      if (pcVar15 == (c2m_ctx_t)0x0) goto LAB_00192247;
      pcVar36 = (c2m_ctx_t)0x0;
      pcVar49 = pcVar15;
      do {
        pcVar49 = (c2m_ctx_t)&pcVar49->options;
        pcVar38 = (c2m_ctx_t)pcVar15->env[0].__jmpbuf[(long)((long)&pcVar36[-1].gen_ctx + 6)];
        if (*(short *)&pcVar38->ctx != 0x20) {
          if ((*(int *)(pcVar38->env[0].__jmpbuf + 1) != 0x17) ||
             (pcVar42 = (c2m_ctx_t)((long)&pcVar36->ctx + 1), pcVar26 <= pcVar42))
          goto LAB_00191e17;
          pcVar51 = pcVar38->options;
          pptVar24 = (token_t *)pcVar38->env[0].__jmpbuf[0];
          pVar9 = *(pos_t *)&pcVar38->options;
          pcVar15 = (c2m_ctx_t)((long)pcVar36 - (long)pcVar26);
          pcVar48 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        pcVar36 = (c2m_ctx_t)((long)&pcVar36->ctx + 1);
      } while (pcVar36 != pcVar26);
LAB_00191e1c:
      pptVar24 = (token_t *)pcVar37->env[0].__jmpbuf[0];
      if (pptVar24 != (token_t *)0x0) {
        pcVar49 = (c2m_ctx_t)(ulong)(*(short *)*pptVar24 == 0x20);
        goto LAB_00191e3b;
      }
      goto LAB_0019224c;
    }
LAB_00191e37:
    pcVar26 = (c2m_ctx_t)0x0;
    pcVar49 = (c2m_ctx_t)0x0;
LAB_00191e3b:
    pcVar38 = (c2m_ctx_t)((long)&pcVar26[-1].gen_ctx + 7);
    if (pcVar49 != pcVar38) {
LAB_00191e88:
      error(pcVar39,0x1c1443,format,pMVar16);
      return;
    }
    if ((pcVar49 < pcVar26) &&
       (pptVar24 = (token_t *)pcVar37->env[0].__jmpbuf[0], pptVar24 != (token_t *)0x0)) {
      ptVar17 = pptVar24[(long)pcVar49];
      sVar1 = *(short *)ptVar17;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar39,ptVar17,in_R8);
        return;
      }
      goto LAB_00191e88;
    }
  }
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  plVar28 = (long *)malloc(0x30);
  pcVar40 = &DAT_00000018;
  *plVar28 = (long)pcVar15;
  plVar28[1] = (long)pcVar38;
  plVar28[2] = extraout_RDX;
  *(undefined4 *)(plVar28 + 4) = 0;
  plVar28[3] = 0;
  puVar29 = (undefined8 *)malloc(0x18);
  plVar28[5] = (long)puVar29;
  if (puVar29 == (undefined8 *)0x0) {
    mir_varr_error(pcVar40);
  }
  *puVar29 = 0;
  puVar29[1] = 0x40;
  pvVar22 = malloc(0x200);
  puVar29[2] = pvVar22;
  return;
}

Assistant:

static void process_replacement (c2m_ctx_t c2m_ctx, macro_call_t mc) {
  macro_t m;
  token_t t, *m_repl;
  VARR (token_t) * arg;
  int i, m_repl_len, sharp_pos, copy_p;

  m = mc->macro;
  sharp_pos = -1;
  m_repl = VARR_ADDR (token_t, m->replacement);
  m_repl_len = (int) VARR_LENGTH (token_t, m->replacement);
  for (;;) {
    if (mc->repl_pos >= m_repl_len) {
      t = get_next_pptoken (c2m_ctx);
      unget_next_pptoken (c2m_ctx, t);
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <%s>\n", get_token_str (t));
#endif
      unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOR, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <EOR>: mc=%lx\n", mc);
#endif
      push_back (c2m_ctx, do_concat (c2m_ctx, mc->repl_buffer));
      m->ignore_p = TRUE;
      return;
    }
    t = m_repl[mc->repl_pos++];
    copy_p = TRUE;
    if (t->code == T_ID) {
      i = find_param (m->params, t->repr);
      if (i >= 0) {
        arg = VARR_GET (token_arr_t, mc->args, i);
        if (sharp_pos >= 0) {
          del_tokens (mc->repl_buffer, sharp_pos, -1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_GET (token_t, arg, 0)->code == ' '
                  || VARR_GET (token_t, arg, 0)->code == '\n'))
            del_tokens (arg, 0, 1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_LAST (token_t, arg)->code == ' ' || VARR_LAST (token_t, arg)->code == '\n'))
            VARR_POP (token_t, arg);
          t = token_stringify (c2m_ctx, mc->macro->id, arg);
          copy_p = FALSE;
        } else if ((mc->repl_pos >= 2 && m_repl[mc->repl_pos - 2]->code == T_RDBLNO)
                   || (mc->repl_pos >= 3 && m_repl[mc->repl_pos - 2]->code == ' '
                       && m_repl[mc->repl_pos - 3]->code == T_RDBLNO)
                   || (mc->repl_pos < m_repl_len && m_repl[mc->repl_pos]->code == T_RDBLNO)
                   || (mc->repl_pos + 1 < m_repl_len && m_repl[mc->repl_pos + 1]->code == T_RDBLNO
                       && m_repl[mc->repl_pos]->code == ' ')) {
          if (VARR_LENGTH (token_t, arg) == 0
              || (VARR_LENGTH (token_t, arg) == 1
                  && (VARR_GET (token_t, arg, 0)->code == ' '
                      || VARR_GET (token_t, arg, 0)->code == '\n'))) {
            t = new_token (c2m_ctx, t->pos, "", T_PLM, N_IGNORE);
            copy_p = FALSE;
          } else {
            add_tokens (mc->repl_buffer, arg);
            continue;
          }
        } else {
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <EOA> for macro %s call\n", mc->macro->id->repr);
#endif
          copy_and_push_back (c2m_ctx, arg, mc->pos);
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_BOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <BOA> for macro %s call\n", mc->macro->id->repr);
#endif
          return;
        }
      }
    } else if (t->code == '#') {
      sharp_pos = (int) VARR_LENGTH (token_t, mc->repl_buffer);
    } else if (t->code != ' ') {
      sharp_pos = -1;
    }
    if (copy_p) t = copy_token (c2m_ctx, t, mc->pos);
    add_token (mc->repl_buffer, t);
  }
}